

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pocketsphinx.c
# Opt level: O3

int ps_set_alignment(ps_decoder_t *ps,ps_alignment_t *al)

{
  int iVar1;
  ps_alignment_t *al_00;
  ps_search_t *search;
  ps_seg_t *ppVar2;
  
  if (al == (ps_alignment_t *)0x0) {
    ppVar2 = ps_seg_iter(ps);
    if (ppVar2 == (ps_seg_t *)0x0) {
      return -1;
    }
    al_00 = ps_alignment_init(ps->d2p);
    do {
      if (ppVar2->wid == -1) {
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/pocketsphinx.c"
                ,0x2ed,"No word ID for segment %s, cannot align\n",ppVar2->text);
        goto LAB_0010a20f;
      }
      ps_alignment_add_word(al_00,ppVar2->wid,ppVar2->sf,(ppVar2->ef - ppVar2->sf) + 1);
      ppVar2 = (*ppVar2->vt->seg_next)(ppVar2);
    } while (ppVar2 != (ps_seg_t *)0x0);
    iVar1 = ps_alignment_populate(al_00);
    if (iVar1 < 0) goto LAB_0010a20f;
  }
  else {
    al_00 = ps_alignment_retain(al);
  }
  search = state_align_search_init("_state_align",ps->config,ps->acmod,al_00);
  if (search != (ps_search_t *)0x0) {
    if (al == (ps_alignment_t *)0x0) {
      ps_alignment_free(al_00);
    }
    iVar1 = set_search_internal(ps,search);
    if (-1 < iVar1) {
      iVar1 = ps_activate_search(ps,"_state_align");
      return iVar1;
    }
  }
  if (al != (ps_alignment_t *)0x0) {
    return -1;
  }
LAB_0010a20f:
  ps_alignment_free(al_00);
  return -1;
}

Assistant:

int
ps_set_alignment(ps_decoder_t *ps, ps_alignment_t *al)
{
    ps_search_t *search;
    int new_alignment = FALSE;
    
    if (al == NULL) {
        ps_seg_t *seg;
        seg = ps_seg_iter(ps);
        if (seg == NULL)
            return -1;
        al = ps_alignment_init(ps->d2p);
        new_alignment = TRUE;
        while (seg) {
            if (seg->wid == BAD_S3WID) {
                E_ERROR("No word ID for segment %s, cannot align\n",
                        seg->text);
                goto error_out;
            }
            ps_alignment_add_word(al, seg->wid, seg->sf, seg->ef - seg->sf + 1);
            seg = ps_seg_next(seg);
        }
        /* FIXME: Add cionly parameter as in SoundSwallower */
        if (ps_alignment_populate(al) < 0)
            goto error_out;
    }
    else
        al = ps_alignment_retain(al);
    search = state_align_search_init("_state_align", ps->config, ps->acmod, al);
    if (search == NULL)
        goto error_out;
    if (new_alignment)
        ps_alignment_free(al);
    if (set_search_internal(ps, search) < 0)
        goto error_out;
    return ps_activate_search(ps, "_state_align");
error_out:
    if (new_alignment)
        ps_alignment_free(al);
    return -1;
}